

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

uint Ga2_ObjComputeTruthSpecial(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  uint local_8c;
  int local_58 [2];
  int pUsed [5];
  int nUsed;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  uint Res;
  int fVerbose;
  Vec_Int_t *vLits_local;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x208,
                  "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  nUsed = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLeaves);
    bVar5 = false;
    if (nUsed < iVar1) {
      iVar1 = Vec_IntEntry(vLeaves,nUsed);
      _Entry = Gia_ManObj(p,iVar1);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pUsed[4] = Vec_IntEntry(vLits,nUsed);
    if (pUsed[4] < 0) {
      __assert_fail("Entry >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x211,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (pUsed[4] == 0) {
      _Entry->Value = 0;
    }
    else if (pUsed[4] == 1) {
      _Entry->Value = 0xffffffff;
    }
    else {
      _Entry->Value = Ga2_ObjComputeTruthSpecial::uTruth5[nUsed];
    }
    nUsed = nUsed + 1;
  }
  pObj._0_4_ = Ga2_ObjComputeTruth_rec(p,pRoot,1);
  if (((uint)pObj != 0) && ((uint)pObj != 0xffffffff)) {
    pUsed[3] = 0;
    for (nUsed = 0; iVar1 = Vec_IntSize(vLeaves), nUsed < iVar1; nUsed = nUsed + 1) {
      uVar2 = Ga2_ObjTruthDepends((uint)pObj,nUsed);
      if (uVar2 != 0) {
        lVar4 = (long)pUsed[3];
        pUsed[3] = pUsed[3] + 1;
        local_58[lVar4] = nUsed;
      }
    }
    if (pUsed[3] < 1) {
      __assert_fail("nUsed > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x22c,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntSelectSortCost(local_58,pUsed[3],vLits);
    iVar1 = Vec_IntEntry(vLits,local_58[0]);
    iVar3 = Vec_IntEntry(vLits,local_58[pUsed[3] + -1]);
    if (iVar3 < iVar1) {
      __assert_fail("Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x22f,
                    "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    nUsed = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vLeaves);
      bVar5 = false;
      if (nUsed < iVar1) {
        iVar1 = Vec_IntEntry(vLeaves,nUsed);
        _Entry = Gia_ManObj(p,iVar1);
        bVar5 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      pUsed[4] = Vec_IntEntry(vLits,nUsed);
      if (pUsed[4] < 0) {
        __assert_fail("Entry >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x234,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (pUsed[4] == 0) {
        _Entry->Value = 0;
      }
      else if (pUsed[4] == 1) {
        _Entry->Value = 0xffffffff;
      }
      else {
        _Entry->Value = 0xdeadcafe;
      }
      nUsed = nUsed + 1;
    }
    for (nUsed = 0; nUsed < pUsed[3]; nUsed = nUsed + 1) {
      pUsed[4] = Vec_IntEntry(vLits,local_58[nUsed]);
      if (pUsed[4] < 2) {
        __assert_fail("Entry > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x23f,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Vec_IntEntry(vLeaves,local_58[nUsed]);
      _Entry = Gia_ManObj(p,iVar1);
      iVar1 = Abc_LitIsCompl(pUsed[4]);
      if (iVar1 == 0) {
        local_8c = Ga2_ObjComputeTruthSpecial::uTruth5[nUsed];
      }
      else {
        local_8c = Ga2_ObjComputeTruthSpecial::uTruth5[nUsed] ^ 0xffffffff;
      }
      _Entry->Value = local_8c;
      iVar1 = Abc_LitRegular(pUsed[4]);
      local_58[nUsed] = iVar1;
    }
    pObj._0_4_ = Ga2_ObjComputeTruth_rec(p,pRoot,1);
    Vec_IntClear(vLits);
    for (nUsed = 0; nUsed < pUsed[3]; nUsed = nUsed + 1) {
      Vec_IntPush(vLits,local_58[nUsed]);
      uVar2 = Ga2_ObjTruthDepends((uint)pObj,nUsed);
      if (uVar2 == 0) {
        __assert_fail("Ga2_ObjTruthDepends(Res, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x24e,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    for (; nUsed < 5; nUsed = nUsed + 1) {
      uVar2 = Ga2_ObjTruthDepends((uint)pObj,nUsed);
      if (uVar2 != 0) {
        __assert_fail("!Ga2_ObjTruthDepends(Res, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x253,
                      "unsigned int Ga2_ObjComputeTruthSpecial(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
  }
  nUsed = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLeaves);
    bVar5 = false;
    if (nUsed < iVar1) {
      iVar1 = Vec_IntEntry(vLeaves,nUsed);
      _Entry = Gia_ManObj(p,iVar1);
      bVar5 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    _Entry->Value = 0;
    nUsed = nUsed + 1;
  }
  return (uint)pObj;
}

Assistant:

unsigned Ga2_ObjComputeTruthSpecial( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vLits )
{
    int fVerbose = 0;
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned Res;
    Gia_Obj_t * pObj;
    int i, Entry;
//    int Id = Gia_ObjId(p, pRoot);
    assert( Gia_ObjIsAnd(pRoot) );

    if ( fVerbose )
    printf( "Object %d.\n", Gia_ObjId(p, pRoot) );

    // assign elementary truth tables
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        Entry = Vec_IntEntry( vLits, i );
        assert( Entry >= 0 );
        if ( Entry == 0 )
            pObj->Value = 0;
        else if ( Entry == 1 )
            pObj->Value = ~0;
        else // non-trivial literal
            pObj->Value = uTruth5[i];
        if ( fVerbose )
        printf( "%d ", Entry );
    }

    if ( fVerbose )
    {
    Res = Ga2_ObjTruth( p, pRoot );
//    Kit_DsdPrintFromTruth( &Res, Vec_IntSize(vLeaves) );
    printf( "\n" );
    }

    // compute truth table
    Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
    if ( Res != 0 && Res != ~0 )
    {
        // find essential variables
        int nUsed = 0, pUsed[5];
        for ( i = 0; i < Vec_IntSize(vLeaves); i++ )
            if ( Ga2_ObjTruthDepends( Res, i ) )
                pUsed[nUsed++] = i;
        assert( nUsed > 0 );
        // order positions by literal value
        Vec_IntSelectSortCost( pUsed, nUsed, vLits );
        assert( Vec_IntEntry(vLits, pUsed[0]) <= Vec_IntEntry(vLits, pUsed[nUsed-1]) );
        // assign elementary truth tables to the leaves
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        {
            Entry = Vec_IntEntry( vLits, i );
            assert( Entry >= 0 );
            if ( Entry == 0 )
                pObj->Value = 0;
            else if ( Entry == 1 )
                pObj->Value = ~0;
            else // non-trivial literal
                pObj->Value = 0xDEADCAFE; // not important
        }
        for ( i = 0; i < nUsed; i++ )
        {
            Entry = Vec_IntEntry( vLits, pUsed[i] );
            assert( Entry > 1 );
            pObj = Gia_ManObj( p, Vec_IntEntry(vLeaves, pUsed[i]) );
            pObj->Value = Abc_LitIsCompl(Entry) ? ~uTruth5[i] : uTruth5[i];
//            pObj->Value = uTruth5[i];
            // remember this literal
            pUsed[i] = Abc_LitRegular(Entry);
//            pUsed[i] = Entry;
        }
        // compute truth table
        Res = Ga2_ObjComputeTruth_rec( p, pRoot, 1 );
        // reload the literals
        Vec_IntClear( vLits );
        for ( i = 0; i < nUsed; i++ )
        {
            Vec_IntPush( vLits, pUsed[i] );
            assert( Ga2_ObjTruthDepends(Res, i) );
            if ( fVerbose )
            printf( "%d ", pUsed[i] );
        }
        for ( ; i < 5; i++ )
            assert( !Ga2_ObjTruthDepends(Res, i) );

if ( fVerbose )
{
//    Kit_DsdPrintFromTruth( &Res, nUsed );
    printf( "\n" );
}

    }
    else
    {

if ( fVerbose )
{
    Vec_IntClear( vLits );
    printf( "Const %d\n", Res > 0 );
}

    }
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
        pObj->Value = 0;
    return Res;
}